

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExporter.cpp
# Opt level: O2

void __thiscall
Assimp::FBXExporter::WriteAnimationCurveNode
          (FBXExporter *this,StreamWriterLE *outstream,int64_t uid,string *name,
          aiVector3D default_value,string *property_name,int64_t layer_uid,int64_t node_uid)

{
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  allocator<char> local_171;
  string local_170;
  float local_14c;
  int64_t uid_local;
  int64_t layer_uid_local;
  undefined1 local_138 [16];
  Node p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  Node n;
  
  local_14c = default_value.z;
  local_138._8_4_ = in_XMM0_Dc;
  local_138._0_8_ = default_value._0_8_;
  local_138._12_4_ = in_XMM0_Dd;
  uid_local = uid;
  layer_uid_local = layer_uid;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&p,"AnimationCurveNode",(allocator<char> *)&local_170);
  FBX::Node::Node(&n,&p.name);
  std::__cxx11::string::~string((string *)&p);
  std::operator+(&p.name,name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 FBX::SEPARATOR_abi_cxx11_);
  std::operator+(&local_b8,&p.name,"AnimCurveNode");
  FBX::Node::AddProperties<long,std::__cxx11::string,char_const*>(&n,uid,&local_b8,"");
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&p);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"Properties70",&local_171)
  ;
  FBX::Node::Node(&p,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"d|X",&local_171);
  FBX::Node::AddP70numberA(&p,&local_170,(double)(float)local_138._0_4_);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"d|Y",&local_171);
  FBX::Node::AddP70numberA(&p,&local_170,(double)(float)local_138._4_4_);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"d|Z",&local_171);
  FBX::Node::AddP70numberA(&p,&local_170,(double)local_14c);
  std::__cxx11::string::~string((string *)&local_170);
  std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>::push_back(&n.children,&p);
  FBX::Node::Dump(&n,outstream,this->binary,1);
  std::vector<Assimp::FBX::Node,std::allocator<Assimp::FBX::Node>>::
  emplace_back<char_const(&)[2],char_const(&)[3],long&,long&>
            ((vector<Assimp::FBX::Node,std::allocator<Assimp::FBX::Node>> *)&this->connections,
             (char (*) [2])0x5c8419,(char (*) [3])"OO",&uid_local,&layer_uid_local);
  std::vector<Assimp::FBX::Node,std::allocator<Assimp::FBX::Node>>::
  emplace_back<char_const(&)[2],char_const(&)[3],long&,long&,std::__cxx11::string&>
            ((vector<Assimp::FBX::Node,std::allocator<Assimp::FBX::Node>> *)&this->connections,
             (char (*) [2])0x5c8419,(char (*) [3])"OP",&uid_local,&node_uid,property_name);
  FBX::Node::~Node(&p);
  FBX::Node::~Node(&n);
  return;
}

Assistant:

void FBXExporter::WriteAnimationCurveNode(
    StreamWriterLE& outstream,
    int64_t uid,
    const std::string& name, // "T", "R", or "S"
    aiVector3D default_value,
    std::string property_name, // "Lcl Translation" etc
    int64_t layer_uid,
    int64_t node_uid
) {
    FBX::Node n("AnimationCurveNode");
    n.AddProperties(uid, name + FBX::SEPARATOR + "AnimCurveNode", "");
    FBX::Node p("Properties70");
    p.AddP70numberA("d|X", default_value.x);
    p.AddP70numberA("d|Y", default_value.y);
    p.AddP70numberA("d|Z", default_value.z);
    n.AddChild(p);
    n.Dump(outstream, binary, 1);
    // connect to layer
    this->connections.emplace_back("C", "OO", uid, layer_uid);
    // connect to bone
    this->connections.emplace_back("C", "OP", uid, node_uid, property_name);
}